

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

int memory_stream_init(memory_stream *ms,char *fill_pattern)

{
  int iVar1;
  size_t __n;
  void *__dest;
  
  ms->read_pos = 0;
  __n = strlen(fill_pattern);
  ms->size = __n;
  (ms->ios).read_some = read_some;
  (ms->ios).write_some = write_some;
  (ms->ios).close = client_close;
  __dest = calloc(1,__n + 1);
  ms->mem = __dest;
  if (__dest == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    memcpy(__dest,fill_pattern,__n);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int memory_stream_init(struct memory_stream *ms, const char *fill_pattern)
{
	ms->read_pos = 0;
	ms->size = strlen(fill_pattern);
	ms->ios.read_some = read_some;
	ms->ios.write_some = write_some;
	ms->ios.close = client_close;
	ms->mem = malloc(ms->size + 1);
	if (ms->mem == NULL) {
		return -1;
	}
	memset(ms->mem, 0x00, ms->size + 1);
	memcpy(ms->mem, fill_pattern, ms->size);
	return 0;
}